

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O1

bool __thiscall
duckdb::CatalogSet::CreateEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *value,
          unique_lock<std::mutex> *read_lock,bool should_be_empty)

{
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  optional_ptr<duckdb::Transaction,_true> transaction_p;
  bool bVar2;
  iterator iVar3;
  DuckTransactionManager *this_00;
  type entry;
  CatalogSet *this_01;
  optional_ptr<duckdb::CatalogEntry,_true> entry_value;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_70;
  unique_lock<std::mutex> *local_68;
  CatalogEntry *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_68 = read_lock;
  iVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                  *)&this->map,name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->map).entries._M_t._M_impl.super__Rb_tree_header) {
    local_60 = (CatalogEntry *)0x0;
  }
  else {
    local_60 = *(CatalogEntry **)(iVar3._M_node + 2);
  }
  if (local_60 == (CatalogEntry *)0x0) {
    transaction_01.context.ptr = transaction.context.ptr;
    transaction_01.db.ptr = transaction.db.ptr;
    transaction_01.transaction.ptr = transaction.transaction.ptr;
    transaction_01.transaction_id = transaction.transaction_id;
    transaction_01.start_time = transaction.start_time;
    bVar2 = StartChain(this,transaction_01,name,local_68);
  }
  else {
    if (!should_be_empty) goto LAB_00d5810d;
    local_38 = transaction.start_time;
    local_48 = transaction.transaction.ptr;
    uStack_40 = transaction.transaction_id;
    local_58 = transaction.db.ptr;
    uStack_50 = transaction.context.ptr;
    this_01 = (CatalogSet *)&stack0xffffffffffffffa0;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::CatalogEntry,_true> *)this_01);
    transaction_00.context.ptr = (ClientContext *)uStack_50;
    transaction_00.db.ptr = (DatabaseInstance *)local_58;
    transaction_00.transaction.ptr = (Transaction *)local_48;
    transaction_00.transaction_id = uStack_40;
    transaction_00.start_time = local_38;
    bVar2 = VerifyVacancy(this_01,transaction_00,local_60);
  }
  if (bVar2 == false) {
    return false;
  }
LAB_00d5810d:
  _Var1._M_head_impl =
       (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>).
       _M_t.super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
  local_70._M_head_impl = _Var1._M_head_impl;
  CatalogEntryMap::UpdateEntry
            (&this->map,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_70);
  if (local_70._M_head_impl != (CatalogEntry *)0x0) {
    (*(local_70._M_head_impl)->_vptr_CatalogEntry[1])();
  }
  local_70._M_head_impl = (CatalogEntry *)0x0;
  if (transaction.transaction.ptr != (Transaction *)0x0) {
    this_00 = DuckTransactionManager::Get((this->catalog->super_Catalog).db);
    optional_ptr<duckdb::Transaction,_true>::CheckValid(&transaction.transaction);
    transaction_p = transaction.transaction;
    entry = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
            operator*(&(_Var1._M_head_impl)->child);
    DuckTransactionManager::PushCatalogEntry(this_00,transaction_p.ptr,entry,(data_ptr_t)0x0,0);
  }
  return true;
}

Assistant:

bool CatalogSet::CreateEntryInternal(CatalogTransaction transaction, const string &name, unique_ptr<CatalogEntry> value,
                                     unique_lock<mutex> &read_lock, bool should_be_empty) {
	auto entry_value = map.GetEntry(name);
	if (!entry_value) {
		// Add a dummy node to start the chain
		if (!StartChain(transaction, name, read_lock)) {
			return false;
		}
	} else if (should_be_empty) {
		// Verify that the entry is deleted, not altered by another transaction
		if (!VerifyVacancy(transaction, *entry_value)) {
			return false;
		}
	}

	// Finally add the new entry to the chain
	auto value_ptr = value.get();
	map.UpdateEntry(std::move(value));
	// Push the old entry in the undo buffer for this transaction, so it can be restored in the event of failure
	if (transaction.transaction) {
		DuckTransactionManager::Get(GetCatalog().GetAttached())
		    .PushCatalogEntry(*transaction.transaction, value_ptr->Child());
	}
	return true;
}